

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O1

bool __thiscall ExternalTester::testAllAcceleration(ExternalTester *this)

{
  Two3KExpSinCos *f;
  TwoOneExpSinCos *f_00;
  TwoOneExpNX2 *f_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  int t;
  uint uVar4;
  char *pcVar5;
  TasmanianSparseGrid grid;
  TasmanianSparseGrid local_b0 [128];
  
  f = &this->f23Kexpsincos;
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid(local_b0);
  iVar2 = (**(this->f23Kexpsincos).super_BaseFunction._vptr_BaseFunction)(f);
  iVar3 = (*(f->super_BaseFunction)._vptr_BaseFunction[1])(f);
  TasGrid::TasmanianSparseGrid::makeGlobalGrid
            ((int)local_b0,iVar2,iVar3,type_qptotal,rule_clenshawcurtis,(int *)0x1,0.0,0.0,
             (char *)0x0,(int *)0x0);
  bVar1 = testAcceleration(this,&f->super_BaseFunction,local_b0);
  f_00 = &this->f21expsincos;
  iVar2 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)(f_00);
  iVar3 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])(f_00);
  TasGrid::TasmanianSparseGrid::makeGlobalGrid
            ((int)local_b0,iVar2,iVar3,type_qptotal,rule_clenshawcurtis,(int *)0x1,0.0,0.0,
             (char *)0x0,(int *)0x0);
  if (bVar1) {
    bVar1 = testAcceleration(this,&f_00->super_BaseFunction,local_b0);
  }
  else {
    bVar1 = false;
  }
  if (bVar1 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Accelerated",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x1c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"global",6);
    pcVar5 = "FAIL";
LAB_001126c3:
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0xf;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  else if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Accelerated",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x1c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"global",6);
    pcVar5 = "Pass";
    goto LAB_001126c3;
  }
  iVar2 = (**(f->super_BaseFunction)._vptr_BaseFunction)(f);
  iVar3 = (*(f->super_BaseFunction)._vptr_BaseFunction[1])(f);
  TasGrid::TasmanianSparseGrid::makeSequenceGrid
            ((int)local_b0,iVar2,iVar3,type_qptotal,rule_clenshawcurtis,(int *)0x6,(int *)0x0);
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = testAcceleration(this,&f->super_BaseFunction,local_b0);
  }
  iVar2 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)(f_00);
  iVar3 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])(f_00);
  TasGrid::TasmanianSparseGrid::makeSequenceGrid
            ((int)local_b0,iVar2,iVar3,type_qptotal,rule_clenshawcurtis,(int *)0x6,(int *)0x0);
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = testAcceleration(this,&f_00->super_BaseFunction,local_b0);
  }
  if (bVar1 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Accelerated",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x1c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sequence",8);
    pcVar5 = "FAIL";
LAB_00112868:
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0xf;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  else if (this->verbose != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Accelerated",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x1c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sequence",8);
    pcVar5 = "Pass";
    goto LAB_00112868;
  }
  uVar4 = 0;
  do {
    iVar2 = (**(f->super_BaseFunction)._vptr_BaseFunction)(f);
    iVar3 = (*(f->super_BaseFunction)._vptr_BaseFunction[1])(f);
    TasGrid::TasmanianSparseGrid::makeLocalPolynomialGrid
              ((int)local_b0,iVar2,iVar3,6 - (uint)(uVar4 < 4),uVar4 >> 2,
               (int *)(ulong)*(uint *)(&DAT_00143060 + (ulong)(uVar4 & 3) * 4));
    if (bVar1 == false) {
      bVar1 = false;
    }
    else {
      bVar1 = testAcceleration(this,&f->super_BaseFunction,local_b0);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0xc);
  f_01 = &this->f21nx2;
  iVar2 = TwoOneExpNX2::getNumInputs(f_01);
  iVar3 = TwoOneExpNX2::getNumOutputs(f_01);
  TasGrid::TasmanianSparseGrid::makeLocalPolynomialGrid
            ((int)local_b0,iVar2,iVar3,5,rule_clenshawcurtis,(int *)0x25);
  TasGrid::TasmanianSparseGrid::favorSparseAcceleration(SUB81(local_b0,0));
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = testAcceleration(this,&f_01->super_BaseFunction,local_b0);
  }
  iVar2 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)(f_00);
  iVar3 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])(f_00);
  TasGrid::TasmanianSparseGrid::makeLocalPolynomialGrid
            ((int)local_b0,iVar2,iVar3,5,rule_clenshawcurtis0,(int *)0x27);
  TasGrid::TasmanianSparseGrid::favorSparseAcceleration(SUB81(local_b0,0));
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = testAcceleration(this,&f_00->super_BaseFunction,local_b0);
  }
  if (bVar1 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Accelerated",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x1c;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"local polynomial",0x10);
    pcVar5 = "FAIL";
LAB_00112ab4:
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0xf;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  else if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Accelerated",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x1c;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"local polynomial",0x10);
    pcVar5 = "Pass";
    goto LAB_00112ab4;
  }
  iVar2 = (**(f->super_BaseFunction)._vptr_BaseFunction)(f);
  iVar3 = (*(f->super_BaseFunction)._vptr_BaseFunction[1])(f);
  TasGrid::TasmanianSparseGrid::makeFourierGrid
            ((int)local_b0,iVar2,iVar3,type_iptotal,(int *)0x1,(int *)0x0);
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = testAcceleration(this,&f->super_BaseFunction,local_b0);
  }
  iVar2 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)(f_00);
  iVar3 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])(f_00);
  TasGrid::TasmanianSparseGrid::makeFourierGrid
            ((int)local_b0,iVar2,iVar3,type_iptotal,(int *)0x1,(int *)0x0);
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = testAcceleration(this,&f_00->super_BaseFunction,local_b0);
  }
  if (bVar1 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Accelerated",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x1c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"fourier",7);
    pcVar5 = "FAIL";
LAB_00112c55:
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0xf;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  else if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Accelerated",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x1c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"fourier",7);
    pcVar5 = "Pass";
    goto LAB_00112c55;
  }
  iVar2 = (**(f->super_BaseFunction)._vptr_BaseFunction)(f);
  iVar3 = (*(f->super_BaseFunction)._vptr_BaseFunction[1])(f);
  TasGrid::TasmanianSparseGrid::makeWaveletGrid((int)local_b0,iVar2,iVar3,2,(int *)0x3);
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = testAcceleration(this,&f->super_BaseFunction,local_b0);
  }
  iVar2 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)(f_00);
  iVar3 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])(f_00);
  TasGrid::TasmanianSparseGrid::makeWaveletGrid((int)local_b0,iVar2,iVar3,4,(int *)0x1);
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = testAcceleration(this,&f_00->super_BaseFunction,local_b0);
  }
  if (bVar1 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Accelerated",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x1c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wavelet",7);
    pcVar5 = "FAIL";
LAB_00112de4:
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0xf;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  else if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Accelerated",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x1c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wavelet",7);
    pcVar5 = "Pass";
    goto LAB_00112de4;
  }
  if (bVar1 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Accelerated",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x1c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"caching",7);
    pcVar5 = "FAIL";
  }
  else {
    if (this->verbose != true) goto LAB_00112f24;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Accelerated",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x1c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"caching",7);
    pcVar5 = "Pass";
  }
  *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0xf;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
LAB_00112f24:
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Accelerated",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x1c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"gpu-to-gpu",10);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0xf;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Skipped (needs Tasmanian_ENABLE_CUDA=ON)",0x28);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Accelerated",0x11);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x1c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"load-values",0xb);
    *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0xf;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Skipped (needs Tasmanian_ENABLE_CUDA=ON)",0x28);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"      Acceleration                        all",0x2d);
  *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0xf;
  pcVar5 = "FAIL";
  if (bVar1 != false) {
    pcVar5 = "Pass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid(local_b0);
  return bVar1;
}

Assistant:

bool ExternalTester::testAllAcceleration() const{
    const BaseFunction *f = &f23Kexpsincos;
    const BaseFunction *f1out = &f21expsincos;
    TasmanianSparseGrid grid;
    bool pass = true;

    int wsecond = 28, wthird = 15;

    grid.makeGlobalGrid(f->getNumInputs(), f->getNumOutputs(), 5, TasGrid::type_level, TasGrid::rule_clenshawcurtis);
    pass = pass && testAcceleration(f, grid);
    grid.makeGlobalGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 5, TasGrid::type_level, TasGrid::rule_clenshawcurtis);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "global" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "global" << setw(wthird) << "FAIL" << endl;
    }

    grid.makeSequenceGrid(f->getNumInputs(), f->getNumOutputs(), 5, TasGrid::type_level, TasGrid::rule_leja);
    pass = pass && testAcceleration(f, grid);
    grid.makeSequenceGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 5, TasGrid::type_level, TasGrid::rule_leja);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "sequence" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "sequence" << setw(wthird) << "FAIL" << endl;
    }

    // for the purpose of testing CUDA evaluations, test all three localp rules vs orders 0, 1, and 2
    // for order 0, regardless of the selected rule, thegrid should switch to localp
    TasGrid::TypeOneDRule pwp_rule[4] = {TasGrid::rule_localp, TasGrid::rule_localp0, TasGrid::rule_semilocalp, TasGrid::rule_localpb};
    for(int t=0; t<12; t++){
        grid.makeLocalPolynomialGrid(f->getNumInputs(), f->getNumOutputs(), ((t / 4 == 0) ? 5 : 6), (t / 4), pwp_rule[t % 4]);
        pass = pass && testAcceleration(f, grid);
    }
    // test cusparse sparse mat times dense vec used in accel_type cuda, also try both sparse and dense flavors
    grid.makeLocalPolynomialGrid(f21nx2.getNumInputs(), f21nx2.getNumOutputs(), 5, 1, TasGrid::rule_localp);
    grid.favorSparseAcceleration(true);
    pass = pass && testAcceleration(&f21nx2, grid);
    grid.makeLocalPolynomialGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 5, 2, TasGrid::rule_semilocalp);
    grid.favorSparseAcceleration(false);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "local polynomial" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "local polynomial" << setw(wthird) << "FAIL" << endl;
    }

    grid.makeFourierGrid(f->getNumInputs(), f->getNumOutputs(), 4, TasGrid::type_level);
    pass = pass && testAcceleration(f, grid);
    grid.makeFourierGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 4, TasGrid::type_level);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "fourier" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "fourier" << setw(wthird) << "FAIL" << endl;
    }

    grid.makeWaveletGrid(f->getNumInputs(), f->getNumOutputs(), 2, 3);
    pass = pass && testAcceleration(f, grid);
    grid.makeWaveletGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 4, 1);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "wavelet" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "wavelet" << setw(wthird) << "FAIL" << endl;
    }

    pass = pass && testGpuCaching();
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "caching" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "caching" << setw(wthird) << "FAIL" << endl;
    }

    #ifdef Tasmanian_ENABLE_GPU
    pass = pass && testGPU2GPUevaluations();
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "gpu-to-gpu" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "gpu-to-gpu" << setw(wthird) << "FAIL" << endl;
    }
    #else
    if (verbose) cout << "      Accelerated" << setw(wsecond) << "gpu-to-gpu" << setw(wthird) << "Skipped (needs Tasmanian_ENABLE_CUDA=ON)" << endl;
    #endif // Tasmanian_ENABLE_GPU

    #ifdef Tasmanian_ENABLE_GPU
    pass = pass && testAcceleratedLoadValues(rule_clenshawcurtis) && testAcceleratedLoadValues(rule_rleja) &&
                   testAcceleratedLoadValues(rule_localp) && testAcceleratedLoadValues(rule_fourier) && testAcceleratedLoadValues(rule_wavelet);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "load-values" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "load-values" << setw(wthird) << "FAIL" << endl;
    }
    #else
    if (verbose) cout << "      Accelerated" << setw(wsecond) << "load-values" << setw(wthird) << "Skipped (needs Tasmanian_ENABLE_CUDA=ON)" << endl;
    #endif

    cout << "      Acceleration                        all" << setw(15) << ((pass) ? "Pass" : "FAIL") << endl;

    return pass;
}